

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_decoder.cc
# Opt level: O1

bool __thiscall
draco::SequentialQuantizationAttributeDecoder::DecodeQuantizedDataInfo
          (SequentialQuantizationAttributeDecoder *this)

{
  bool bVar1;
  PointAttribute *attribute;
  
  attribute = SequentialAttributeDecoder::GetPortableAttribute((SequentialAttributeDecoder *)this);
  if (attribute == (PointAttribute *)0x0) {
    attribute = (this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.
                attribute_;
  }
  bVar1 = AttributeQuantizationTransform::DecodeParameters
                    (&this->quantization_transform_,attribute,
                     ((this->super_SequentialIntegerAttributeDecoder).
                      super_SequentialAttributeDecoder.decoder_)->buffer_);
  return bVar1;
}

Assistant:

bool SequentialQuantizationAttributeDecoder::DecodeQuantizedDataInfo() {
  // Get attribute used as source for decoding.
  auto att = GetPortableAttribute();
  if (att == nullptr) {
    // This should happen only in the backward compatibility mode. It will still
    // work fine for this case because the only thing the quantization transform
    // cares about is the number of components that is the same for both source
    // and target attributes.
    att = attribute();
  }
  return quantization_transform_.DecodeParameters(*att, decoder()->buffer());
}